

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

void __thiscall
QProxyStyle::drawControl
          (QProxyStyle *this,ControlElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  (**(code **)(*(long *)pQVar1 + 0xb8))(pQVar1,element,option,painter,widget);
  return;
}

Assistant:

void QProxyStyle::drawControl(ControlElement element, const QStyleOption *option, QPainter *painter, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    d->baseStyle->drawControl(element, option, painter, widget);
}